

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmMakefile *mf,cmGeneratedFileStream *fout)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint uVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  cmGlobalGenerator *pcVar6;
  long lVar7;
  pointer ppcVar8;
  __node_base *p_Var9;
  _Alloc_hider target;
  string currentDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string makeArgs;
  string make;
  allocator local_d3;
  char local_d2;
  allocator local_d1;
  cmGeneratedFileStream *local_d0;
  string local_c8;
  string local_a8;
  string local_80;
  string local_60;
  pointer local_40;
  cmMakefile *local_38;
  
  local_d0 = fout;
  std::__cxx11::string::string((string *)&local_80,"CMAKE_MAKE_PROGRAM",(allocator *)&local_c8);
  pcVar3 = cmMakefile::GetRequiredDefinition(mf,&local_80);
  std::__cxx11::string::string((string *)&local_60,pcVar3,(allocator *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string
            ((string *)&local_c8,"CMAKE_KATE_MAKE_ARGUMENTS",(allocator *)&local_a8);
  pcVar3 = cmMakefile::GetSafeDefinition(mf,&local_c8);
  std::__cxx11::string::string((string *)&local_80,pcVar3,&local_d3);
  std::__cxx11::string::~string((string *)&local_c8);
  pcVar3 = cmMakefile::GetHomeOutputDirectory(mf);
  poVar4 = std::operator<<((ostream *)local_d0,"\t\"build\": {\n\t\t\"directory\": \"");
  pcVar5 = cmMakefile::GetHomeOutputDirectory(mf);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n"
                 );
  poVar4 = std::operator<<((ostream *)local_d0,"\t\t\"build\": \"");
  poVar4 = std::operator<<(poVar4,(string *)&local_60);
  poVar4 = std::operator<<(poVar4," -C \\\"");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,"\\\" ");
  poVar4 = std::operator<<(poVar4,(string *)&local_80);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,"all\",\n");
  poVar4 = std::operator<<((ostream *)local_d0,"\t\t\"clean\": \"");
  poVar4 = std::operator<<(poVar4,(string *)&local_60);
  poVar4 = std::operator<<(poVar4," -C \\\"");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,"\\\" ");
  poVar4 = std::operator<<(poVar4,(string *)&local_80);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,"clean\",\n");
  poVar4 = std::operator<<((ostream *)local_d0,"\t\t\"quick\": \"");
  poVar4 = std::operator<<(poVar4,(string *)&local_60);
  poVar4 = std::operator<<(poVar4," -C \\\"");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,"\\\" ");
  poVar4 = std::operator<<(poVar4,(string *)&local_80);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,"install\",\n");
  std::operator<<((ostream *)local_d0,"\t\t\"targets\":[\n");
  std::__cxx11::string::string((string *)&local_c8,"all",&local_d3);
  std::__cxx11::string::string((string *)&local_a8,pcVar3,&local_d1);
  AppendTarget(this,local_d0,&local_c8,&local_60,&local_80,&local_a8,pcVar3);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_c8,"clean",&local_d3);
  std::__cxx11::string::string((string *)&local_a8,pcVar3,&local_d1);
  AppendTarget(this,local_d0,&local_c8,&local_60,&local_80,&local_a8,pcVar3);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  pcVar6 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar8 = (pcVar6->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppcVar8 ==
        (pcVar6->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator<<((ostream *)local_d0,"\t] }\n");
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
      return;
    }
    this_00 = (*ppcVar8)->Makefile;
    local_40 = ppcVar8;
    pcVar5 = cmMakefile::GetCurrentBinaryDirectory(this_00);
    std::__cxx11::string::string((string *)&local_c8,pcVar5,(allocator *)&local_a8);
    pcVar5 = cmMakefile::GetHomeOutputDirectory(this_00);
    local_d2 = std::operator==(&local_c8,pcVar5);
    p_Var9 = &(this_00->Targets)._M_h._M_before_begin;
    local_38 = this_00;
LAB_00301e52:
    p_Var9 = p_Var9->_M_nxt;
    if (p_Var9 != (__node_base *)0x0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1);
      uVar1 = *(uint *)&p_Var9[0x61]._M_nxt;
      if (uVar1 < 5) {
        AppendTarget(this,local_d0,__lhs,&local_60,&local_80,&local_c8,pcVar3);
        std::__cxx11::string::string((string *)&local_a8,(string *)__lhs);
        std::__cxx11::string::append((char *)&local_a8);
        AppendTarget(this,local_d0,&local_a8,&local_60,&local_80,&local_c8,pcVar3);
        std::__cxx11::string::~string((string *)&local_a8);
        goto LAB_00301e52;
      }
      if (uVar1 == 5) {
        lVar7 = std::__cxx11::string::find((char *)__lhs,0x47b738);
        if (lVar7 == 0) break;
        goto LAB_00301fb6;
      }
      if ((uVar1 == 6) && (local_d2 != '\0')) {
        bVar2 = std::operator==(__lhs,"edit_cache");
        if (bVar2) {
          std::__cxx11::string::string((string *)&local_a8,"CMAKE_EDIT_COMMAND",&local_d3);
          pcVar5 = cmMakefile::GetDefinition(local_38,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          if (pcVar5 == (char *)0x0) goto LAB_00301e52;
          pcVar5 = strstr(pcVar5,"ccmake");
          if (pcVar5 != (char *)0x0) goto LAB_00301e52;
        }
        AppendTarget(this,local_d0,__lhs,&local_60,&local_80,&local_c8,pcVar3);
      }
      goto LAB_00301e52;
    }
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    (*(*local_40)->_vptr_cmLocalGenerator[0xb])(*local_40,&local_a8);
    for (target._M_p = local_a8._M_dataplus._M_p; target._M_p != (pointer)local_a8._M_string_length;
        target._M_p = target._M_p + 0x20) {
      AppendTarget(this,local_d0,(string *)target._M_p,&local_60,&local_80,&local_c8,pcVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    ppcVar8 = local_40 + 1;
    pcVar6 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  } while( true );
  bVar2 = std::operator!=(__lhs,"Nightly");
  if (!bVar2) {
LAB_00301fb6:
    lVar7 = std::__cxx11::string::find((char *)__lhs,0x47b740);
    if (lVar7 == 0) {
      bVar2 = std::operator!=(__lhs,"Continuous");
      if (bVar2) goto LAB_00301e52;
    }
    lVar7 = std::__cxx11::string::find((char *)__lhs,0x47b74b);
    if (lVar7 == 0) {
      bVar2 = std::operator!=(__lhs,"Experimental");
      if (bVar2) goto LAB_00301e52;
    }
    AppendTarget(this,local_d0,__lhs,&local_60,&local_80,&local_c8,pcVar3);
  }
  goto LAB_00301e52;
}

Assistant:

void
cmExtraKateGenerator::WriteTargets(const cmMakefile* mf,
                                   cmGeneratedFileStream& fout) const
{
  const std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs = mf->GetSafeDefinition(
    "CMAKE_KATE_MAKE_ARGUMENTS");
  const char* homeOutputDir = mf->GetHomeOutputDirectory();

  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << mf->GetHomeOutputDirectory() << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "install\",\n";

  // this is for kate >= 4.13:
  fout <<
  "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs,
                     homeOutputDir, homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs,
                     homeOutputDir, homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator
       it = this->GlobalGenerator->GetLocalGenerators().begin();
       it != this->GlobalGenerator->GetLocalGenerators().end();
       ++it)
    {
    const cmTargets& targets = (*it)->GetMakefile()->GetTargets();
    cmMakefile* makefile=(*it)->GetMakefile();
    std::string currentDir = makefile->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == makefile->GetHomeOutputDirectory());

    for(cmTargets::const_iterator ti=targets.begin(); ti!=targets.end(); ++ti)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::GLOBAL_TARGET:
          {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel)
            {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (ti->first == "edit_cache")
              {
              const char* editCommand = makefile->GetDefinition
              ("CMAKE_EDIT_COMMAND");
              if (editCommand == 0)
                {
                insertTarget = false;
                }
              else if (strstr(editCommand, "ccmake")!=NULL)
                {
                insertTarget = false;
                }
              }
            }
          if (insertTarget)
            {
            this->AppendTarget(fout, ti->first, make, makeArgs,
                               currentDir, homeOutputDir);
            }
        }
        break;
        case cmTarget::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((ti->first.find("Nightly")==0)   &&(ti->first!="Nightly"))
            || ((ti->first.find("Continuous")==0)&&(ti->first!="Continuous"))
            || ((ti->first.find("Experimental")==0)
            && (ti->first!="Experimental")))
            {
              break;
            }

            this->AppendTarget(fout, ti->first, make, makeArgs,
                               currentDir, homeOutputDir);
          break;
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
        {
          this->AppendTarget(fout, ti->first, make, makeArgs,
                             currentDir, homeOutputDir);
          std::string fastTarget = ti->first;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, make, makeArgs,
                             currentDir, homeOutputDir);

        }
        break;
        default:
          break;
      }
    }

    //insert rules for compiling, preprocessing and assembling individual files
    std::vector<std::string> objectFileTargets;
    (*it)->GetIndividualFileTargets(objectFileTargets);
    for(std::vector<std::string>::const_iterator fit=objectFileTargets.begin();
        fit != objectFileTargets.end();
        ++fit)
      {
      this->AppendTarget(fout, *fit, make, makeArgs, currentDir,homeOutputDir);
      }
  }

  fout <<
  "\t] }\n";
}